

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_parse_compact
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input64)

{
  long in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  long in_RDI;
  int overflow;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  int iVar1;
  uint uVar2;
  secp256k1_callback *in_stack_ffffffffffffffa0;
  uchar *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  secp256k1_scalar local_40;
  secp256k1_ecdsa_signature *local_18;
  uint local_4;
  
  uVar2 = 1;
  iVar1 = 0;
  if (in_RDI != 0) {
    if (in_RSI == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_callback_call(in_stack_ffffffffffffffa0,(char *)0x100000000);
      local_4 = 0;
    }
    else if (in_RDX == 0) {
      secp256k1_callback_call(in_stack_ffffffffffffffa0,(char *)0x100000000);
      local_4 = 0;
    }
    else {
      local_18 = in_RSI;
      secp256k1_scalar_set_b32
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (int *)in_stack_ffffffffffffffa0);
      uVar2 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar2;
      secp256k1_scalar_set_b32
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (int *)in_stack_ffffffffffffffa0);
      uVar2 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar2;
      if (uVar2 == 0) {
        memset(local_18,0,0x40);
        local_4 = uVar2;
      }
      else {
        secp256k1_ecdsa_signature_save
                  (local_18,&local_40,(secp256k1_scalar *)&stack0xffffffffffffffa0);
        local_4 = uVar2;
      }
    }
    return local_4;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/secp256k1.c"
          ,0x186,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ecdsa_signature_parse_compact(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input64) {
    secp256k1_scalar r, s;
    int ret = 1;
    int overflow = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input64 != NULL);

    secp256k1_scalar_set_b32(&r, &input64[0], &overflow);
    ret &= !overflow;
    secp256k1_scalar_set_b32(&s, &input64[32], &overflow);
    ret &= !overflow;
    if (ret) {
        secp256k1_ecdsa_signature_save(sig, &r, &s);
    } else {
        memset(sig, 0, sizeof(*sig));
    }
    return ret;
}